

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.h
# Opt level: O0

enable_if_t<HasSize<InlinedVector<float,_4>_>::value_&&_HasData<InlinedVector<float,_4>_>::value,_std::ostream_&>
 pbrt::detail::operator<<
           (ostream *os,InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *v)

{
  const_pointer pfVar1;
  size_t sVar2;
  ostream *poVar3;
  InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *in_RSI;
  ostream *in_RDI;
  size_t i;
  const_pointer ptr;
  ulong local_20;
  
  std::operator<<(in_RDI,"[ ");
  pfVar1 = InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::data(in_RSI);
  local_20 = 0;
  while( true ) {
    sVar2 = InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::size(in_RSI);
    if (sVar2 <= local_20) break;
    std::ostream::operator<<(in_RDI,pfVar1[local_20]);
    sVar2 = InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::size(in_RSI);
    if (local_20 < sVar2 - 1) {
      std::operator<<(in_RDI,", ");
    }
    local_20 = local_20 + 1;
  }
  poVar3 = std::operator<<(in_RDI," ]");
  return poVar3;
}

Assistant:

inline std::enable_if_t<HasSize<T>::value && HasData<T>::value, std::ostream &>
operator<<(std::ostream &os, const T &v) {
    os << "[ ";
    auto ptr = v.data();
    for (size_t i = 0; i < v.size(); ++i) {
        os << ptr[i];
        if (i < v.size() - 1)
            os << ", ";
    }
    return os << " ]";
}